

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O3

bool cmCMakeHostSystemInformationCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  long lVar1;
  pointer pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int *piVar4;
  char *pcVar5;
  pointer pbVar6;
  long *plVar7;
  string_view separator;
  string_view name;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  string sVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  _anonymous_namespace_ *p_Var14;
  const_iterator cVar15;
  _Rb_tree_node_base *p_Var16;
  optional<cmWindowsRegistry::View> oVar17;
  ulong uVar18;
  string *psVar19;
  size_t value_00;
  size_t value_01;
  char *value_02;
  size_t value_03;
  size_t value_04;
  char *value_05;
  size_t value_06;
  char *value_07;
  size_t value_08;
  char *value_09;
  char *value_10;
  size_t value_11;
  size_t value_12;
  size_t value_13;
  char *value_14;
  size_t value_15;
  size_t value_16;
  size_t value_17;
  size_t value_18;
  size_t value_19;
  size_t value_20;
  size_t value_21;
  char *value_22;
  size_t value_23;
  size_t value_24;
  cmExecutionStatus *status_00;
  _Storage<cmWindowsRegistry::View,_true> view;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view sVar42;
  string_view name_06;
  string_view value_25;
  string_view value_26;
  string_view separator_00;
  string_view key;
  string_view value_27;
  string_view key_00;
  string_view value_28;
  string_view key_01;
  string_view value_29;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmWindowsRegistry registry;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  Arguments arguments;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidArgs;
  string result_list;
  string cmake_var_name;
  cmArgumentParser<Arguments> parser;
  size_t in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  string local_2d8;
  byte local_2b8;
  cmMakefile *local_2b0;
  string local_2a8;
  string local_288 [8];
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Base_ptr local_260;
  size_t local_258;
  _Base_ptr local_250;
  size_t local_248;
  pointer local_240 [2];
  undefined2 local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  char *local_208;
  pointer local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  string local_1e8;
  pointer local_1c8;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [8];
  string *psStack_198;
  undefined1 local_190 [16];
  _Any_data local_180;
  undefined1 local_170 [16];
  bool local_160;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  local_138;
  char *local_108;
  size_t local_100;
  char local_f8;
  undefined7 uStack_f7;
  string local_e8;
  string *local_c8;
  cmMakefile *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  uVar18 = (long)paVar3 - (long)pbVar2 >> 5;
  if (((uVar18 < 2) || (pbVar2->_M_string_length != 6)) ||
     (piVar4 = (int *)(pbVar2->_M_dataplus)._M_p,
     (short)piVar4[1] != 0x544c || *piVar4 != 0x55534552)) {
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"missing RESULT specification.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00414dd1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
    }
    return false;
  }
  if (((uVar18 < 4) || (pbVar2[2]._M_string_length != 5)) ||
     (piVar4 = (int *)pbVar2[2]._M_dataplus._M_p, (char)piVar4[1] != 'Y' || *piVar4 != 0x52455551))
  {
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"missing QUERY specification","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_00414dd1;
  }
  local_1c8 = pbVar2 + 1;
  if (pbVar2[3]._M_string_length != 0x10) {
LAB_00414e99:
    if ((cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::info == '\0') &&
       (iVar12 = __cxa_guard_acquire(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                      ::info), iVar12 != 0)) {
      cmsys::SystemInformation::SystemInformation(&cmCMakeHostSystemInformationCommand::info);
      __cxa_atexit(cmsys::SystemInformation::~SystemInformation,
                   &cmCMakeHostSystemInformationCommand::info,&__dso_handle);
      __cxa_guard_release(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::info);
    }
    if (cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::initialized == '\0') {
      cmsys::SystemInformation::RunCPUCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunOSCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunMemoryCheck(&cmCMakeHostSystemInformationCommand::info);
      cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::initialized = '\x01';
    }
    local_108 = &local_f8;
    local_100 = 0;
    local_f8 = '\0';
    if (0x7f < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      local_c8 = (string *)&status->Error;
      local_2b0 = (cmMakefile *)0x3;
      local_48 = 0x414349535948505f;
      uStack_40 = 0x59524f4d454d5f4c;
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_108,
                   (&(anonymous_namespace)::DELIM_abi_cxx11_)[(ulong)(local_100 != 0) * 4]);
        pbVar6 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_138.second._M_invoker = (_Invoker_type)(pbVar6 + (long)local_2b0);
        if (0x15 < pbVar6[(long)local_2b0]._M_string_length - 4) goto switchD_00414fc0_caseD_5;
        plVar7 = (long *)pbVar6[(long)local_2b0]._M_dataplus._M_p;
        switch(pbVar6[(long)local_2b0]._M_string_length) {
        case 4:
          if ((int)*plVar7 != 0x4e445146) break;
          cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
                    ((string *)&local_b8,&cmCMakeHostSystemInformationCommand::info);
          local_280._0_8_ = &local_270;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_280,local_b8._M_allocated_capacity,
                     local_b8._8_8_ + local_b8._M_allocated_capacity);
          local_2d8._M_dataplus._M_p = (pointer)local_280._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ == &local_270) {
            local_2d8.field_2._8_8_ = local_270._8_8_;
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          }
          local_2d8.field_2._M_allocated_capacity = local_270._M_allocated_capacity;
          local_2d8._M_string_length = local_280._8_8_;
          local_280._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
          local_2b8 = 1;
          local_280._0_8_ = &local_270;
          if ((undefined1 *)local_b8._M_allocated_capacity != local_a8) {
            operator_delete((void *)local_b8._M_allocated_capacity,local_a8._0_8_ + 1);
            if ((local_2b8 & 1) != 0) goto LAB_00415b30;
            goto LAB_00415570;
          }
          goto LAB_00415b30;
        case 7:
          if (*(int *)((long)plVar7 + 3) == 0x5550465f && (int)*plVar7 == 0x5f534148) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,0x800000);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_16);
          }
          else if (*(int *)((long)plVar7 + 3) == 0x584d4d5f && (int)*plVar7 == 0x5f534148) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,1);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_21);
          }
          else if (*(int *)((long)plVar7 + 3) == 0x4553535f && (int)*plVar7 == 0x5f534148) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,4);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_24);
          }
          else {
            if (*(int *)((long)plVar7 + 3) != 0x454d414e || (int)*plVar7 != 0x4e5f534f) break;
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetOSName
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_05);
          }
          goto LAB_00415ae6;
        case 8:
          if (*plVar7 == 0x454d414e54534f48) {
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetHostname
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_14);
          }
          else if (*plVar7 == 0x54494234365f5349) {
            bVar11 = cmsys::SystemInformation::Is64Bits(&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_20);
          }
          else if (*plVar7 == 0x324553535f534148) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,8);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_23);
          }
          else {
            if (*plVar7 != 0x343641495f534148) break;
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,0x40);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_03);
          }
          goto LAB_00415ae6;
        case 10:
          if ((short)plVar7[1] == 0x5046 && *plVar7 == 0x5f4553535f534148) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,0x800);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_17);
          }
          else if ((short)plVar7[1] == 0x4553 && *plVar7 == 0x41454c45525f534f) {
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetOSRelease
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_22);
          }
          else {
            if ((short)plVar7[1] != 0x4e4f || *plVar7 != 0x49535245565f534f) break;
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetOSVersion
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_09);
          }
          goto LAB_00415ae6;
        case 0xb:
          if (*(long *)((long)plVar7 + 3) == 0x584d4d5f4553535f && *plVar7 == 0x5f4553535f534148) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,0x1000);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_18);
          }
          else {
            if (*(long *)((long)plVar7 + 3) != 0x4d524f4654414c50 || *plVar7 != 0x4654414c505f534f)
            break;
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetOSPlatform
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_10);
          }
          goto LAB_00415ae6;
        case 0xc:
          if ((int)plVar7[1] == 0x53554c50 && *plVar7 == 0x5f584d4d5f534148) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,2);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_04);
            goto LAB_00415ae6;
          }
          break;
        case 0xd:
          if (*(long *)((long)plVar7 + 5) == 0x574f4e44335f444d && *plVar7 == 0x5f444d415f534148) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,0x10);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_06);
            goto LAB_00415ae6;
          }
          break;
        case 0xe:
          if (*(long *)((long)plVar7 + 6) == 0x454d414e5f524f53 && *plVar7 == 0x4f535345434f5250) {
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetExtendedProcessorName
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_07);
            goto LAB_00415ae6;
          }
          break;
        case 0x11:
          auVar31[0] = -((char)*plVar7 == 'H');
          auVar31[1] = -(*(char *)((long)plVar7 + 1) == 'A');
          auVar31[2] = -(*(char *)((long)plVar7 + 2) == 'S');
          auVar31[3] = -(*(char *)((long)plVar7 + 3) == '_');
          auVar31[4] = -(*(char *)((long)plVar7 + 4) == 'S');
          auVar31[5] = -(*(char *)((long)plVar7 + 5) == 'E');
          auVar31[6] = -(*(char *)((long)plVar7 + 6) == 'R');
          auVar31[7] = -(*(char *)((long)plVar7 + 7) == 'I');
          auVar31[8] = -((char)plVar7[1] == 'A');
          auVar31[9] = -(*(char *)((long)plVar7 + 9) == 'L');
          auVar31[10] = -(*(char *)((long)plVar7 + 10) == '_');
          auVar31[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'N');
          auVar31[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'U');
          auVar31[0xd] = -(*(char *)((long)plVar7 + 0xd) == 'M');
          auVar31[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'B');
          auVar31[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'E');
          auVar41[0] = -((char)plVar7[2] == 'R');
          auVar41[1] = 0xff;
          auVar41[2] = 0xff;
          auVar41[3] = 0xff;
          auVar41[4] = 0xff;
          auVar41[5] = 0xff;
          auVar41[6] = 0xff;
          auVar41[7] = 0xff;
          auVar41[8] = 0xff;
          auVar41[9] = 0xff;
          auVar41[10] = 0xff;
          auVar41[0xb] = 0xff;
          auVar41[0xc] = 0xff;
          auVar41[0xd] = 0xff;
          auVar41[0xe] = 0xff;
          auVar41[0xf] = 0xff;
          auVar41 = auVar41 & auVar31;
          if ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,0x200);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_19);
            goto LAB_00415ae6;
          }
          break;
        case 0x12:
          auVar30[0] = -((char)*plVar7 == 'H');
          auVar30[1] = -(*(char *)((long)plVar7 + 1) == 'A');
          auVar30[2] = -(*(char *)((long)plVar7 + 2) == 'S');
          auVar30[3] = -(*(char *)((long)plVar7 + 3) == '_');
          auVar30[4] = -(*(char *)((long)plVar7 + 4) == 'A');
          auVar30[5] = -(*(char *)((long)plVar7 + 5) == 'M');
          auVar30[6] = -(*(char *)((long)plVar7 + 6) == 'D');
          auVar30[7] = -(*(char *)((long)plVar7 + 7) == '_');
          auVar30[8] = -((char)plVar7[1] == '3');
          auVar30[9] = -(*(char *)((long)plVar7 + 9) == 'D');
          auVar30[10] = -(*(char *)((long)plVar7 + 10) == 'N');
          auVar30[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'O');
          auVar30[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'W');
          auVar30[0xd] = -(*(char *)((long)plVar7 + 0xd) == '_');
          auVar30[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'P');
          auVar30[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'L');
          auVar40[0] = -((char)(short)plVar7[2] == 'U');
          auVar40[1] = -((char)((ushort)(short)plVar7[2] >> 8) == 'S');
          auVar40[2] = 0xff;
          auVar40[3] = 0xff;
          auVar40[4] = 0xff;
          auVar40[5] = 0xff;
          auVar40[6] = 0xff;
          auVar40[7] = 0xff;
          auVar40[8] = 0xff;
          auVar40[9] = 0xff;
          auVar40[10] = 0xff;
          auVar40[0xb] = 0xff;
          auVar40[0xc] = 0xff;
          auVar40[0xd] = 0xff;
          auVar40[0xe] = 0xff;
          auVar40[0xf] = 0xff;
          auVar40 = auVar40 & auVar30;
          if ((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) == 0xffff) {
            bVar11 = cmsys::SystemInformation::DoesCPUSupportFeature
                               (&cmCMakeHostSystemInformationCommand::info,0x20);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)bVar11,value_11);
            goto LAB_00415ae6;
          }
          break;
        case 0x14:
          auVar24[0] = -((char)*plVar7 == 'T');
          auVar24[1] = -(*(char *)((long)plVar7 + 1) == 'O');
          auVar24[2] = -(*(char *)((long)plVar7 + 2) == 'T');
          auVar24[3] = -(*(char *)((long)plVar7 + 3) == 'A');
          auVar24[4] = -(*(char *)((long)plVar7 + 4) == 'L');
          auVar24[5] = -(*(char *)((long)plVar7 + 5) == '_');
          auVar24[6] = -(*(char *)((long)plVar7 + 6) == 'V');
          auVar24[7] = -(*(char *)((long)plVar7 + 7) == 'I');
          auVar24[8] = -((char)plVar7[1] == 'R');
          auVar24[9] = -(*(char *)((long)plVar7 + 9) == 'T');
          auVar24[10] = -(*(char *)((long)plVar7 + 10) == 'U');
          auVar24[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'A');
          auVar24[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'L');
          auVar24[0xd] = -(*(char *)((long)plVar7 + 0xd) == '_');
          auVar24[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'M');
          auVar24[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'E');
          iVar12 = (int)plVar7[2];
          auVar34[0] = -((char)iVar12 == 'M');
          auVar34[1] = -((char)((uint)iVar12 >> 8) == 'O');
          auVar34[2] = -((char)((uint)iVar12 >> 0x10) == 'R');
          auVar34[3] = -((char)((uint)iVar12 >> 0x18) == 'Y');
          auVar34[4] = 0xff;
          auVar34[5] = 0xff;
          auVar34[6] = 0xff;
          auVar34[7] = 0xff;
          auVar34[8] = 0xff;
          auVar34[9] = 0xff;
          auVar34[10] = 0xff;
          auVar34[0xb] = 0xff;
          auVar34[0xc] = 0xff;
          auVar34[0xd] = 0xff;
          auVar34[0xe] = 0xff;
          auVar34[0xf] = 0xff;
          auVar34 = auVar34 & auVar24;
          if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff) {
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetTotalVirtualMemory
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_01);
            goto LAB_00415ae6;
          }
          break;
        case 0x15:
          auVar27[0] = -((char)*plVar7 == 'T');
          auVar27[1] = -(*(char *)((long)plVar7 + 1) == 'O');
          auVar27[2] = -(*(char *)((long)plVar7 + 2) == 'T');
          auVar27[3] = -(*(char *)((long)plVar7 + 3) == 'A');
          auVar27[4] = -(*(char *)((long)plVar7 + 4) == 'L');
          auVar27[5] = -(*(char *)((long)plVar7 + 5) == '_');
          auVar27[6] = -(*(char *)((long)plVar7 + 6) == 'P');
          auVar27[7] = -(*(char *)((long)plVar7 + 7) == 'H');
          auVar27[8] = -((char)plVar7[1] == 'Y');
          auVar27[9] = -(*(char *)((long)plVar7 + 9) == 'S');
          auVar27[10] = -(*(char *)((long)plVar7 + 10) == 'I');
          auVar27[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'C');
          auVar27[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'A');
          auVar27[0xd] = -(*(char *)((long)plVar7 + 0xd) == 'L');
          auVar27[0xe] = -(*(char *)((long)plVar7 + 0xe) == '_');
          auVar27[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'M');
          auVar37[0] = -(*(char *)((long)plVar7 + 5) == (char)local_48);
          auVar37[1] = -(*(char *)((long)plVar7 + 6) == local_48._1_1_);
          auVar37[2] = -(*(char *)((long)plVar7 + 7) == local_48._2_1_);
          auVar37[3] = -((char)plVar7[1] == local_48._3_1_);
          auVar37[4] = -(*(char *)((long)plVar7 + 9) == local_48._4_1_);
          auVar37[5] = -(*(char *)((long)plVar7 + 10) == local_48._5_1_);
          auVar37[6] = -(*(char *)((long)plVar7 + 0xb) == local_48._6_1_);
          auVar37[7] = -(*(char *)((long)plVar7 + 0xc) == local_48._7_1_);
          auVar37[8] = -(*(char *)((long)plVar7 + 0xd) == (char)uStack_40);
          auVar37[9] = -(*(char *)((long)plVar7 + 0xe) == uStack_40._1_1_);
          auVar37[10] = -(*(char *)((long)plVar7 + 0xf) == uStack_40._2_1_);
          auVar37[0xb] = -((char)plVar7[2] == uStack_40._3_1_);
          auVar37[0xc] = -(*(char *)((long)plVar7 + 0x11) == uStack_40._4_1_);
          auVar37[0xd] = -(*(char *)((long)plVar7 + 0x12) == uStack_40._5_1_);
          auVar37[0xe] = -(*(char *)((long)plVar7 + 0x13) == uStack_40._6_1_);
          auVar37[0xf] = -(*(char *)((long)plVar7 + 0x14) == uStack_40._7_1_);
          auVar37 = auVar37 & auVar27;
          if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) == 0xffff) {
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetTotalPhysicalMemory
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_15);
          }
          else {
            auVar28[0] = -((char)*plVar7 == 'P');
            auVar28[1] = -(*(char *)((long)plVar7 + 1) == 'R');
            auVar28[2] = -(*(char *)((long)plVar7 + 2) == 'O');
            auVar28[3] = -(*(char *)((long)plVar7 + 3) == 'C');
            auVar28[4] = -(*(char *)((long)plVar7 + 4) == 'E');
            auVar28[5] = -(*(char *)((long)plVar7 + 5) == 'S');
            auVar28[6] = -(*(char *)((long)plVar7 + 6) == 'S');
            auVar28[7] = -(*(char *)((long)plVar7 + 7) == 'O');
            auVar28[8] = -((char)plVar7[1] == 'R');
            auVar28[9] = -(*(char *)((long)plVar7 + 9) == '_');
            auVar28[10] = -(*(char *)((long)plVar7 + 10) == 'D');
            auVar28[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'E');
            auVar28[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'S');
            auVar28[0xd] = -(*(char *)((long)plVar7 + 0xd) == 'C');
            auVar28[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'R');
            auVar28[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'I');
            auVar38[0] = -(*(char *)((long)plVar7 + 5) == 'S');
            auVar38[1] = -(*(char *)((long)plVar7 + 6) == 'S');
            auVar38[2] = -(*(char *)((long)plVar7 + 7) == 'O');
            auVar38[3] = -((char)plVar7[1] == 'R');
            auVar38[4] = -(*(char *)((long)plVar7 + 9) == '_');
            auVar38[5] = -(*(char *)((long)plVar7 + 10) == 'D');
            auVar38[6] = -(*(char *)((long)plVar7 + 0xb) == 'E');
            auVar38[7] = -(*(char *)((long)plVar7 + 0xc) == 'S');
            auVar38[8] = -(*(char *)((long)plVar7 + 0xd) == 'C');
            auVar38[9] = -(*(char *)((long)plVar7 + 0xe) == 'R');
            auVar38[10] = -(*(char *)((long)plVar7 + 0xf) == 'I');
            auVar38[0xb] = -((char)plVar7[2] == 'P');
            auVar38[0xc] = -(*(char *)((long)plVar7 + 0x11) == 'T');
            auVar38[0xd] = -(*(char *)((long)plVar7 + 0x12) == 'I');
            auVar38[0xe] = -(*(char *)((long)plVar7 + 0x13) == 'O');
            auVar38[0xf] = -(*(char *)((long)plVar7 + 0x14) == 'N');
            auVar38 = auVar38 & auVar28;
            if ((ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) != 0xffff) break;
            cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
                      ((string *)local_280,&cmCMakeHostSystemInformationCommand::info);
          }
          goto LAB_00415ae6;
        case 0x17:
          auVar25[0] = -((char)*plVar7 == 'N');
          auVar25[1] = -(*(char *)((long)plVar7 + 1) == 'U');
          auVar25[2] = -(*(char *)((long)plVar7 + 2) == 'M');
          auVar25[3] = -(*(char *)((long)plVar7 + 3) == 'B');
          auVar25[4] = -(*(char *)((long)plVar7 + 4) == 'E');
          auVar25[5] = -(*(char *)((long)plVar7 + 5) == 'R');
          auVar25[6] = -(*(char *)((long)plVar7 + 6) == '_');
          auVar25[7] = -(*(char *)((long)plVar7 + 7) == 'O');
          auVar25[8] = -((char)plVar7[1] == 'F');
          auVar25[9] = -(*(char *)((long)plVar7 + 9) == '_');
          auVar25[10] = -(*(char *)((long)plVar7 + 10) == 'L');
          auVar25[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'O');
          auVar25[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'G');
          auVar25[0xd] = -(*(char *)((long)plVar7 + 0xd) == 'I');
          auVar25[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'C');
          auVar25[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'A');
          auVar35[0] = -(*(char *)((long)plVar7 + 7) == 'O');
          auVar35[1] = -((char)plVar7[1] == 'F');
          auVar35[2] = -(*(char *)((long)plVar7 + 9) == '_');
          auVar35[3] = -(*(char *)((long)plVar7 + 10) == 'L');
          auVar35[4] = -(*(char *)((long)plVar7 + 0xb) == 'O');
          auVar35[5] = -(*(char *)((long)plVar7 + 0xc) == 'G');
          auVar35[6] = -(*(char *)((long)plVar7 + 0xd) == 'I');
          auVar35[7] = -(*(char *)((long)plVar7 + 0xe) == 'C');
          auVar35[8] = -(*(char *)((long)plVar7 + 0xf) == 'A');
          auVar35[9] = -((char)plVar7[2] == 'L');
          auVar35[10] = -(*(char *)((long)plVar7 + 0x11) == '_');
          auVar35[0xb] = -(*(char *)((long)plVar7 + 0x12) == 'C');
          auVar35[0xc] = -(*(char *)((long)plVar7 + 0x13) == 'O');
          auVar35[0xd] = -(*(char *)((long)plVar7 + 0x14) == 'R');
          auVar35[0xe] = -(*(char *)((long)plVar7 + 0x15) == 'E');
          auVar35[0xf] = -(*(char *)((long)plVar7 + 0x16) == 'S');
          auVar35 = auVar35 & auVar25;
          if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) == 0xffff) {
            uVar13 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                               (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)uVar13,value_13);
          }
          else {
            auVar26[0] = -((char)*plVar7 == 'P');
            auVar26[1] = -(*(char *)((long)plVar7 + 1) == 'R');
            auVar26[2] = -(*(char *)((long)plVar7 + 2) == 'O');
            auVar26[3] = -(*(char *)((long)plVar7 + 3) == 'C');
            auVar26[4] = -(*(char *)((long)plVar7 + 4) == 'E');
            auVar26[5] = -(*(char *)((long)plVar7 + 5) == 'S');
            auVar26[6] = -(*(char *)((long)plVar7 + 6) == 'S');
            auVar26[7] = -(*(char *)((long)plVar7 + 7) == 'O');
            auVar26[8] = -((char)plVar7[1] == 'R');
            auVar26[9] = -(*(char *)((long)plVar7 + 9) == '_');
            auVar26[10] = -(*(char *)((long)plVar7 + 10) == 'S');
            auVar26[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'E');
            auVar26[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'R');
            auVar26[0xd] = -(*(char *)((long)plVar7 + 0xd) == 'I');
            auVar26[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'A');
            auVar26[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'L');
            auVar36[0] = -(*(char *)((long)plVar7 + 7) == 'O');
            auVar36[1] = -((char)plVar7[1] == 'R');
            auVar36[2] = -(*(char *)((long)plVar7 + 9) == '_');
            auVar36[3] = -(*(char *)((long)plVar7 + 10) == 'S');
            auVar36[4] = -(*(char *)((long)plVar7 + 0xb) == 'E');
            auVar36[5] = -(*(char *)((long)plVar7 + 0xc) == 'R');
            auVar36[6] = -(*(char *)((long)plVar7 + 0xd) == 'I');
            auVar36[7] = -(*(char *)((long)plVar7 + 0xe) == 'A');
            auVar36[8] = -(*(char *)((long)plVar7 + 0xf) == 'L');
            auVar36[9] = -((char)plVar7[2] == '_');
            auVar36[10] = -(*(char *)((long)plVar7 + 0x11) == 'N');
            auVar36[0xb] = -(*(char *)((long)plVar7 + 0x12) == 'U');
            auVar36[0xc] = -(*(char *)((long)plVar7 + 0x13) == 'M');
            auVar36[0xd] = -(*(char *)((long)plVar7 + 0x14) == 'B');
            auVar36[0xe] = -(*(char *)((long)plVar7 + 0x15) == 'E');
            auVar36[0xf] = -(*(char *)((long)plVar7 + 0x16) == 'R');
            auVar36 = auVar36 & auVar26;
            if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) != 0xffff) break;
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetProcessorSerialNumber
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_02);
          }
          goto LAB_00415ae6;
        case 0x18:
          auVar22[0] = -((char)*plVar7 == 'N');
          auVar22[1] = -(*(char *)((long)plVar7 + 1) == 'U');
          auVar22[2] = -(*(char *)((long)plVar7 + 2) == 'M');
          auVar22[3] = -(*(char *)((long)plVar7 + 3) == 'B');
          auVar22[4] = -(*(char *)((long)plVar7 + 4) == 'E');
          auVar22[5] = -(*(char *)((long)plVar7 + 5) == 'R');
          auVar22[6] = -(*(char *)((long)plVar7 + 6) == '_');
          auVar22[7] = -(*(char *)((long)plVar7 + 7) == 'O');
          auVar22[8] = -((char)plVar7[1] == 'F');
          auVar22[9] = -(*(char *)((long)plVar7 + 9) == '_');
          auVar22[10] = -(*(char *)((long)plVar7 + 10) == 'P');
          auVar22[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'H');
          auVar22[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'Y');
          auVar22[0xd] = -(*(char *)((long)plVar7 + 0xd) == 'S');
          auVar22[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'I');
          auVar22[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'C');
          lVar1 = plVar7[2];
          auVar32[0] = -((char)lVar1 == 'A');
          auVar32[1] = -((char)((ulong)lVar1 >> 8) == 'L');
          auVar32[2] = -((char)((ulong)lVar1 >> 0x10) == '_');
          auVar32[3] = -((char)((ulong)lVar1 >> 0x18) == 'C');
          auVar32[4] = -((char)((ulong)lVar1 >> 0x20) == 'O');
          auVar32[5] = -((char)((ulong)lVar1 >> 0x28) == 'R');
          auVar32[6] = -((char)((ulong)lVar1 >> 0x30) == 'E');
          auVar32[7] = -((char)((ulong)lVar1 >> 0x38) == 'S');
          auVar32[8] = 0xff;
          auVar32[9] = 0xff;
          auVar32[10] = 0xff;
          auVar32[0xb] = 0xff;
          auVar32[0xc] = 0xff;
          auVar32[0xd] = 0xff;
          auVar32[0xe] = 0xff;
          auVar32[0xf] = 0xff;
          auVar32 = auVar32 & auVar22;
          if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
            uVar13 = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                               (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)(ulong)uVar13,value_12);
          }
          else {
            auVar23[0] = -((char)*plVar7 == 'A');
            auVar23[1] = -(*(char *)((long)plVar7 + 1) == 'V');
            auVar23[2] = -(*(char *)((long)plVar7 + 2) == 'A');
            auVar23[3] = -(*(char *)((long)plVar7 + 3) == 'I');
            auVar23[4] = -(*(char *)((long)plVar7 + 4) == 'L');
            auVar23[5] = -(*(char *)((long)plVar7 + 5) == 'A');
            auVar23[6] = -(*(char *)((long)plVar7 + 6) == 'B');
            auVar23[7] = -(*(char *)((long)plVar7 + 7) == 'L');
            auVar23[8] = -((char)plVar7[1] == 'E');
            auVar23[9] = -(*(char *)((long)plVar7 + 9) == '_');
            auVar23[10] = -(*(char *)((long)plVar7 + 10) == 'V');
            auVar23[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'I');
            auVar23[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'R');
            auVar23[0xd] = -(*(char *)((long)plVar7 + 0xd) == 'T');
            auVar23[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'U');
            auVar23[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'A');
            lVar1 = plVar7[2];
            auVar33[0] = -((char)lVar1 == 'L');
            auVar33[1] = -((char)((ulong)lVar1 >> 8) == '_');
            auVar33[2] = -((char)((ulong)lVar1 >> 0x10) == 'M');
            auVar33[3] = -((char)((ulong)lVar1 >> 0x18) == 'E');
            auVar33[4] = -((char)((ulong)lVar1 >> 0x20) == 'M');
            auVar33[5] = -((char)((ulong)lVar1 >> 0x28) == 'O');
            auVar33[6] = -((char)((ulong)lVar1 >> 0x30) == 'R');
            auVar33[7] = -((char)((ulong)lVar1 >> 0x38) == 'Y');
            auVar33[8] = 0xff;
            auVar33[9] = 0xff;
            auVar33[10] = 0xff;
            auVar33[0xb] = 0xff;
            auVar33[0xc] = 0xff;
            auVar33[0xd] = 0xff;
            auVar33[0xe] = 0xff;
            auVar33[0xf] = 0xff;
            auVar33 = auVar33 & auVar23;
            if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) != 0xffff) break;
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetAvailableVirtualMemory
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_00);
          }
LAB_00415ae6:
          local_2d8._M_dataplus._M_p = (pointer)local_280._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ == &local_270) {
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            local_2d8.field_2._8_8_ = local_270._8_8_;
          }
          local_2d8.field_2._M_allocated_capacity = local_270._M_allocated_capacity;
          local_2d8._M_string_length = local_280._8_8_;
          local_2b8 = 1;
LAB_00415b30:
          local_2a8._M_dataplus._M_p = local_2d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p == &local_2d8.field_2) {
            local_2a8.field_2._8_8_ = local_2d8.field_2._8_8_;
            local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          }
          local_2a8.field_2._M_allocated_capacity = local_2d8.field_2._M_allocated_capacity;
          local_2a8._M_string_length = local_2d8._M_string_length;
          local_2d8._M_string_length = 0;
          local_2d8.field_2._M_allocated_capacity =
               local_2d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_288[0] = (string)0x1;
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          goto LAB_00415b7d;
        case 0x19:
          auVar29[0] = -((char)*plVar7 == 'A');
          auVar29[1] = -(*(char *)((long)plVar7 + 1) == 'V');
          auVar29[2] = -(*(char *)((long)plVar7 + 2) == 'A');
          auVar29[3] = -(*(char *)((long)plVar7 + 3) == 'I');
          auVar29[4] = -(*(char *)((long)plVar7 + 4) == 'L');
          auVar29[5] = -(*(char *)((long)plVar7 + 5) == 'A');
          auVar29[6] = -(*(char *)((long)plVar7 + 6) == 'B');
          auVar29[7] = -(*(char *)((long)plVar7 + 7) == 'L');
          auVar29[8] = -((char)plVar7[1] == 'E');
          auVar29[9] = -(*(char *)((long)plVar7 + 9) == '_');
          auVar29[10] = -(*(char *)((long)plVar7 + 10) == 'P');
          auVar29[0xb] = -(*(char *)((long)plVar7 + 0xb) == 'H');
          auVar29[0xc] = -(*(char *)((long)plVar7 + 0xc) == 'Y');
          auVar29[0xd] = -(*(char *)((long)plVar7 + 0xd) == 'S');
          auVar29[0xe] = -(*(char *)((long)plVar7 + 0xe) == 'I');
          auVar29[0xf] = -(*(char *)((long)plVar7 + 0xf) == 'C');
          auVar39[0] = -(*(char *)((long)plVar7 + 9) == (char)local_48);
          auVar39[1] = -(*(char *)((long)plVar7 + 10) == local_48._1_1_);
          auVar39[2] = -(*(char *)((long)plVar7 + 0xb) == local_48._2_1_);
          auVar39[3] = -(*(char *)((long)plVar7 + 0xc) == local_48._3_1_);
          auVar39[4] = -(*(char *)((long)plVar7 + 0xd) == local_48._4_1_);
          auVar39[5] = -(*(char *)((long)plVar7 + 0xe) == local_48._5_1_);
          auVar39[6] = -(*(char *)((long)plVar7 + 0xf) == local_48._6_1_);
          auVar39[7] = -((char)plVar7[2] == local_48._7_1_);
          auVar39[8] = -(*(char *)((long)plVar7 + 0x11) == (char)uStack_40);
          auVar39[9] = -(*(char *)((long)plVar7 + 0x12) == uStack_40._1_1_);
          auVar39[10] = -(*(char *)((long)plVar7 + 0x13) == uStack_40._2_1_);
          auVar39[0xb] = -(*(char *)((long)plVar7 + 0x14) == uStack_40._3_1_);
          auVar39[0xc] = -(*(char *)((long)plVar7 + 0x15) == uStack_40._4_1_);
          auVar39[0xd] = -(*(char *)((long)plVar7 + 0x16) == uStack_40._5_1_);
          auVar39[0xe] = -(*(char *)((long)plVar7 + 0x17) == uStack_40._6_1_);
          auVar39[0xf] = -((char)plVar7[3] == uStack_40._7_1_);
          auVar39 = auVar39 & auVar29;
          if ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) == 0xffff) {
            p_Var14 = (_anonymous_namespace_ *)
                      cmsys::SystemInformation::GetAvailablePhysicalMemory
                                (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_280,p_Var14,value_08);
            goto LAB_00415ae6;
          }
        }
switchD_00414fc0_caseD_5:
        local_2b8 = 0;
LAB_00415570:
        local_280._8_8_ = ((_Alloc_hider *)local_138.second._M_invoker)->_M_p;
        local_280._0_8_ = *(size_type *)((long)local_138.second._M_invoker + 8);
        p_Var14 = (_anonymous_namespace_ *)0x0;
        __str._M_str = "DISTRIB_";
        __str._M_len = 8;
        iVar12 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_280,0,8,__str)
        ;
        psVar19 = local_288;
        if (iVar12 == 0) {
          if (((anonymous_namespace)::
               GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
               ::s_os_release_abi_cxx11_ == '\0') &&
             (iVar12 = __cxa_guard_acquire(&(anonymous_namespace)::
                                            GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                            ::s_os_release_abi_cxx11_), iVar12 != 0)) {
            (anonymous_namespace)::GetOSReleaseVariables_abi_cxx11_
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)status->Makefile,p_Var14,status_00);
            __cxa_atexit(std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::~map,(anonymous_namespace)::
                                GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                ::s_os_release_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                 ::s_os_release_abi_cxx11_);
          }
          local_c0 = status->Makefile;
          std::__cxx11::string::substr((ulong)&local_138,(ulong)local_138.second._M_invoker);
          if ((local_138.first._M_str == (char *)0x4) &&
             (*(int *)local_138.first._M_len == 0x4f464e49)) {
            local_158.Begin._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148;
            local_158.End._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_148._M_local_buf[0] = '\0';
            p_Var16 = (_Rb_tree_node_base *)
                      (anonymous_namespace)::
                      GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                      ::s_os_release_abi_cxx11_._24_8_;
            if ((anonymous_namespace)::
                GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                ::s_os_release_abi_cxx11_._24_8_ == 0xbe6f30) {
LAB_004159e1:
              local_1c0._0_8_ = &local_1b0;
              local_1b0._M_allocated_capacity =
                   CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
              local_1b0._8_8_ = local_148._8_8_;
            }
            else {
              do {
                local_280._8_8_ = pbVar2[1]._M_dataplus._M_p;
                local_280._0_8_ = pbVar2[1]._M_string_length;
                local_270._M_allocated_capacity = 0;
                local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            )(ZEXT816(1) << 0x40);
                local_260 = (_Base_ptr)(local_a8 + 8);
                local_a8[8] = 0x5f;
                local_a8._0_8_ = local_260;
                local_270._8_8_ = 1;
                local_258 = 0;
                local_248 = *(size_t *)(p_Var16 + 1);
                local_250 = p_Var16[1]._M_parent;
                local_240[0] = (pointer)0x0;
                views._M_len = 3;
                views._M_array = (iterator)local_280;
                cmCatViews(&local_e8,views);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_280,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (&(anonymous_namespace)::DELIM_abi_cxx11_ +
                               (ulong)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                        *)local_158.End._M_current !=
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)0x0) * 4),&local_e8);
                std::__cxx11::string::_M_append((char *)&local_158,local_280._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_280._0_8_ != &local_270) {
                  operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
                }
                value_25._M_str = *(char **)(p_Var16 + 2);
                value_25._M_len = (size_t)p_Var16[2]._M_parent;
                cmMakefile::AddDefinition(local_c0,&local_e8,value_25);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
              } while (p_Var16 !=
                       (_Rb_tree_node_base *)
                       ((anonymous_namespace)::
                        GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                        ::s_os_release_abi_cxx11_ + 8));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.Begin._M_current == &local_148) goto LAB_004159e1;
              local_1c0._0_8_ = local_158.Begin._M_current;
              local_1b0._M_allocated_capacity =
                   CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
            }
            local_1c0._8_8_ = local_158.End._M_current;
          }
          else {
            cVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(anonymous_namespace)::
                               GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::s_os_release_abi_cxx11_,(key_type *)&local_138);
            if (cVar15._M_node ==
                (_Base_ptr)
                ((anonymous_namespace)::
                 GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::s_os_release_abi_cxx11_ + 8)) {
              local_1c0._0_8_ = &local_1b0;
              local_1b0._M_allocated_capacity = local_1b0._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_1c0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
            }
            else {
              local_1c0._0_8_ = &local_1b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1c0,*(long *)(cVar15._M_node + 2),
                         (long)&(cVar15._M_node[2]._M_parent)->_M_color +
                         *(long *)(cVar15._M_node + 2));
            }
          }
          local_1a0[0] = (string)0x1;
          if ((function<void_(ArgumentParser::Instance_&)> *)local_138.first._M_len !=
              &local_138.second) {
            operator_delete((void *)local_138.first._M_len,
                            (ulong)(local_138.second.super__Function_base._M_functor._M_unused.
                                    _M_member_pointer + 1));
            psVar19 = local_288;
            if (((undefined1  [16])_local_1a0 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            goto LAB_00415a97;
          }
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._0_8_ == &local_1b0) {
            local_2a8.field_2._8_8_ = local_1b0._8_8_;
          }
          else {
            local_2a8._M_dataplus._M_p = (pointer)local_1c0._0_8_;
          }
          local_2a8.field_2._M_allocated_capacity = local_1b0._M_allocated_capacity;
          local_2a8._M_string_length = local_1c0._8_8_;
          local_288[0] = (string)0x1;
          psVar19 = (string *)local_1a0;
        }
LAB_00415a97:
        *psVar19 = (string)0x0;
LAB_00415b7d:
        if (((local_2b8 & 1) != 0) &&
           (local_2b8 = 0,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_2d8._M_dataplus._M_p != &local_2d8.field_2)) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        sVar10 = local_288[0];
        if (local_288[0] == (string)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_280,"does not recognize <key> ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138.second._M_invoker);
          std::__cxx11::string::_M_assign(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ != &local_270) {
            operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_2a8._M_dataplus._M_p);
        }
        if ((local_288[0] == (string)0x1) &&
           (local_288[0] = (string)0x0,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if (sVar10 == (string)0x0) {
          bVar11 = false;
          goto LAB_00415d73;
        }
        local_2b0 = (cmMakefile *)
                    ((long)&(local_2b0->FindPackageRootPathStack).
                            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map + 1);
      } while (local_2b0 <
               (cmMakefile *)
               ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    bVar11 = true;
    value_26._M_str = local_108;
    value_26._M_len = local_100;
    cmMakefile::AddDefinition(status->Makefile,local_1c8,value_26);
LAB_00415d73:
    if (local_108 == &local_f8) {
      return bVar11;
    }
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
    return bVar11;
  }
  pcVar5 = pbVar2[3]._M_dataplus._M_p;
  auVar21[0] = -(*pcVar5 == 'W');
  auVar21[1] = -(pcVar5[1] == 'I');
  auVar21[2] = -(pcVar5[2] == 'N');
  auVar21[3] = -(pcVar5[3] == 'D');
  auVar21[4] = -(pcVar5[4] == 'O');
  auVar21[5] = -(pcVar5[5] == 'W');
  auVar21[6] = -(pcVar5[6] == 'S');
  auVar21[7] = -(pcVar5[7] == '_');
  auVar21[8] = -(pcVar5[8] == 'R');
  auVar21[9] = -(pcVar5[9] == 'E');
  auVar21[10] = -(pcVar5[10] == 'G');
  auVar21[0xb] = -(pcVar5[0xb] == 'I');
  auVar21[0xc] = -(pcVar5[0xc] == 'S');
  auVar21[0xd] = -(pcVar5[0xd] == 'T');
  auVar21[0xe] = -(pcVar5[0xe] == 'R');
  auVar21[0xf] = -(pcVar5[0xf] == 'Y');
  if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf)
      != 0xffff) goto LAB_00414e99;
  local_158.Begin._M_current = pbVar2 + 4;
  local_158.End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.Begin._M_current == paVar3) {
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"missing <key> specification.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_00414dd1;
  }
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )0x0;
  name_00.super_string_view._M_str = "VALUE";
  name_00.super_string_view._M_len = 5;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_b8._M_local_buf,name_00,0x30);
  name_01.super_string_view._M_str = "VALUE_NAMES";
  name_01.super_string_view._M_len = 0xb;
  cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&local_b8,name_01,0x50);
  name_02.super_string_view._M_str = "SUBKEYS";
  name_02.super_string_view._M_len = 7;
  cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&local_b8,name_02,0x51);
  name_03.super_string_view._M_str = "VIEW";
  name_03.super_string_view._M_len = 4;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_b8._M_local_buf,name_03,0x58);
  name_04.super_string_view._M_str = "SEPARATOR";
  name_04.super_string_view._M_len = 9;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_b8._M_local_buf,name_04,0x78);
  name_05.super_string_view._M_str = "ERROR_VARIABLE";
  name_05.super_string_view._M_len = 0xe;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_b8._M_local_buf,name_05,0x98);
  local_1b0._M_allocated_capacity = (size_type)&local_138;
  local_138.first._M_len = 0;
  local_138.first._M_str = (char *)0x0;
  local_158.Begin._M_current = local_158.Begin._M_current + 1;
  local_138.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_270._8_8_ = local_280 + 8;
  local_280._8_8_ = (ulong)(uint)local_280._12_4_ << 0x20;
  local_270._M_allocated_capacity = 0;
  local_258 = 0;
  local_248 = 0;
  local_240[0] = (pointer)((ulong)local_240[0] & 0xffffffffffffff00);
  local_230 = 0;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_208 = &local_1f8;
  local_200 = (pointer)0x0;
  local_1f8 = '\0';
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1c0._8_8_ = local_280;
  local_1a0 = (undefined1  [8])0x0;
  psStack_198 = (string *)0x0;
  local_190 = (undefined1  [16])0x0;
  local_180 = (_Any_data)0x0;
  local_170 = (undefined1  [16])0x0;
  local_160 = false;
  local_260 = (_Base_ptr)local_270._8_8_;
  local_250 = (_Base_ptr)local_240;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1c0._0_8_ = &local_b8;
  local_1b0._8_8_ = local_1c0._8_8_;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_1c0,&local_158,0);
  if ((_Manager_type)local_170._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_170._0_8_)(&local_180,&local_180,__destroy_functor);
  }
  if ((char *)local_138.first._M_len != local_138.first._M_str) {
    separator_00._M_str = ", ";
    separator_00._M_len = 2;
    cmJoin(&local_2a8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_138,separator_00,(string_view)ZEXT816(0));
    local_1c0._0_8_ = (pointer)0x1b;
    local_1c0._8_8_ = "given invalid argument(s) \"";
    local_1b0._M_allocated_capacity = 0;
    local_1b0._8_8_ = local_2a8._M_string_length;
    psStack_198 = &local_2a8;
    local_1a0 = (undefined1  [8])local_2a8._M_dataplus._M_p;
    local_190._8_8_ = "\".";
    local_190._0_8_ = 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_180._8_8_;
    local_180 = (_Any_data)(auVar8 << 0x40);
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_1c0;
    cmCatViews(&local_2d8,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    bVar20 = false;
    goto LAB_00416448;
  }
  bVar11 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_280,status->Makefile);
  bVar20 = true;
  if (bVar11) goto LAB_00416448;
  if (local_248 == 0) {
    if (((char)local_230 != '\0') && (local_230._1_1_ == '\x01')) goto LAB_004160fa;
LAB_0041615a:
    if ((local_228._M_string_length == 0) ||
       (sVar42._M_str = in_stack_fffffffffffffd20, sVar42._M_len = in_stack_fffffffffffffd18,
       oVar17 = cmWindowsRegistry::ToView(sVar42),
       ((ulong)oVar17.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
               super__Optional_payload_base<cmWindowsRegistry::View> >> 0x20 & 1) != 0)) {
      local_2b0 = status->Makefile;
      view._M_value = Both;
      cmMakefile::AddDefinition(local_2b0,local_1c8,(string_view)(ZEXT816(0x98e619) << 0x40));
      if (local_228._M_string_length != 0) {
        name._M_str = in_stack_fffffffffffffd20;
        name._M_len = in_stack_fffffffffffffd18;
        oVar17 = cmWindowsRegistry::ToView(name);
        view._M_value =
             oVar17.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
             super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
      }
      cmWindowsRegistry::cmWindowsRegistry
                ((cmWindowsRegistry *)&local_2d8,local_2b0,&cmWindowsRegistry::AllTypes);
      if ((char)local_230 == '\x01') {
        key._M_str = pbVar2[4]._M_dataplus._M_p;
        key._M_len = pbVar2[4]._M_string_length;
        cmWindowsRegistry::GetValueNames_abi_cxx11_
                  ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1c0,(cmWindowsRegistry *)&local_2d8,key,view._M_value);
        if (local_1b0._M_local_buf[8] == 1) {
          cmList::
          to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                    (&local_2a8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1c0);
          value_27._M_str = local_2a8._M_dataplus._M_p;
          value_27._M_len = local_2a8._M_string_length;
          cmMakefile::AddDefinition(local_2b0,local_1c8,value_27);
LAB_004162f7:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
LAB_00416319:
        if ((local_1b0._M_local_buf[8] & 1U) != 0) {
          local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c0);
        }
      }
      else {
        if (local_230._1_1_ == '\x01') {
          key_00._M_str = pbVar2[4]._M_dataplus._M_p;
          key_00._M_len = pbVar2[4]._M_string_length;
          cmWindowsRegistry::GetSubKeys_abi_cxx11_
                    ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_1c0,(cmWindowsRegistry *)&local_2d8,key_00,view._M_value);
          if (local_1b0._M_local_buf[8] == 1) {
            cmList::
            to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                      (&local_2a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1c0);
            value_28._M_str = local_2a8._M_dataplus._M_p;
            value_28._M_len = local_2a8._M_string_length;
            cmMakefile::AddDefinition(local_2b0,local_1c8,value_28);
            goto LAB_004162f7;
          }
          goto LAB_00416319;
        }
        local_e8._M_dataplus._M_p = local_200;
        local_e8._M_string_length = (size_type)local_208;
        separator._M_str = local_208;
        separator._M_len = (size_t)local_200;
        name_06._M_str = (char *)local_250;
        name_06._M_len = local_248;
        key_01._M_str = pbVar2[4]._M_dataplus._M_p;
        key_01._M_len = pbVar2[4]._M_string_length;
        cmWindowsRegistry::ReadValue_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c0,(cmWindowsRegistry *)&local_2d8,key_01,name_06,view._M_value,
                   separator);
        if (local_1a0[0] == (string)0x1) {
          value_29._M_str = (char *)local_1c0._0_8_;
          value_29._M_len = local_1c0._8_8_;
          cmMakefile::AddDefinition(local_2b0,local_1c8,value_29);
        }
        if (((byte)local_1a0[0] & 1) != 0) {
          auVar9[0xf] = 0;
          auVar9._0_15_ = stack0xfffffffffffffe61;
          _local_1a0 = (string_view)(auVar9 << 8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._0_8_ != &local_1b0) {
            operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
          }
        }
      }
      if (local_1e8._M_string_length != 0) {
        sVar42 = cmWindowsRegistry::GetLastError((cmWindowsRegistry *)&local_2d8);
        cmMakefile::AddDefinition(local_2b0,&local_1e8,sVar42);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00416448;
    }
    local_2d8._M_dataplus._M_p._0_1_ = 0x2e;
    cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char>
              ((string *)local_1c0,(char (*) [33])"given invalid value for \"VIEW\": ",&local_228,
               (char *)&local_2d8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != &local_1b0) {
LAB_00416143:
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
    }
  }
  else {
    if (((char)local_230 == '\0') && (local_230._1_1_ == '\0')) goto LAB_0041615a;
LAB_004160fa:
    local_1c0._0_8_ = &local_1b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,
               "given mutually exclusive sub-options \"VALUE\", \"VALUE_NAMES\" or \"SUBKEYS\".","")
    ;
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != &local_1b0) goto LAB_00416143;
  }
  bVar20 = false;
LAB_00416448:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if (local_250 != (_Base_ptr)local_240) {
    operator_delete(local_250,(ulong)((long)&local_240[0]->first + 1));
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_138);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
             *)(local_68 + 8));
  if ((code *)local_78._8_8_ != (code *)0x0) {
    (*(code *)local_78._8_8_)
              ((_Any_data *)(local_88 + 8),(_Any_data *)(local_88 + 8),__destroy_functor);
  }
  if ((code *)local_98._8_8_ != (code *)0x0) {
    (*(code *)local_98._8_8_)(local_a8 + 8,local_a8 + 8,3);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_b8);
  return bVar20;
}

Assistant:

bool cmCMakeHostSystemInformationCommand(std::vector<std::string> const& args,
                                         cmExecutionStatus& status)
{
  std::size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT"_s) {
    status.SetError("missing RESULT specification.");
    return false;
  }

  auto const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY"_s) {
    status.SetError("missing QUERY specification");
    return false;
  }

  if (args[current_index + 1] == "WINDOWS_REGISTRY"_s) {
    return QueryWindowsRegistry(cmMakeRange(args).advance(current_index + 2),
                                status, variable);
  }

  static cmsys::SystemInformation info;
  static auto initialized = false;
  if (!initialized) {
    info.RunCPUCheck();
    info.RunOSCheck();
    info.RunMemoryCheck();
    initialized = true;
  }

  std::string result_list;
  for (auto i = current_index + 1; i < args.size(); ++i) {
    result_list += DELIM[!result_list.empty()];

    auto const& key = args[i];
    // clang-format off
    auto value =
      GetValueChained(
          [&]() { return GetValue(info, key); }
        , [&]() { return GetDistribValue(status, key, variable); }
#ifdef _WIN32
        , [&]() { return GetWindowsValue(status, key); }
#endif
        );
    // clang-format on
    if (!value) {
      status.SetError("does not recognize <key> " + key);
      return false;
    }
    result_list += value.value();
  }

  status.GetMakefile().AddDefinition(variable, result_list);

  return true;
}